

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastunpack24_8(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  uVar1 = *in;
  auVar7._8_8_ = 0x1000000018;
  auVar7._0_8_ = 0x1000000018;
  auVar8._8_8_ = 0x1000000008;
  auVar8._0_8_ = 0x1000000008;
  uVar2 = in[3];
  *out = uVar1 & 0xffffff;
  uVar3 = *(ulong *)(in + 1);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar3;
  auVar4 = vpunpckldq_avx(ZEXT416(uVar1),auVar6);
  auVar5 = vpsllvd_avx2(auVar6,auVar8);
  auVar4 = vpsrlvd_avx2(auVar4,auVar7);
  auVar4 = vpternlogd_avx512vl(auVar5,auVar4,ZEXT816(0xff000000ffff00),0xec);
  *(long *)(out + 1) = auVar4._0_8_;
  out[3] = (uint)(uVar3 >> 0x28);
  out[4] = uVar2 & 0xffffff;
  uVar3 = *(ulong *)(in + 4);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar3;
  auVar4 = vpunpckldq_avx(ZEXT416(uVar2),auVar5);
  auVar5 = vpsllvd_avx2(auVar5,auVar8);
  auVar4 = vpsrlvd_avx2(auVar4,auVar7);
  auVar4 = vpternlogd_avx512vl(auVar5,auVar4,ZEXT816(0xff000000ffff00),0xec);
  *(long *)(out + 5) = auVar4._0_8_;
  out[7] = (uint)(uVar3 >> 0x28);
  return in + 6;
}

Assistant:

const uint32_t *__fastunpack24_8(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 24);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 16)) << (24 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 8)) << (24 - 8);
  out++;
  *out = ((*in) >> 8);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 24);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 16)) << (24 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 8)) << (24 - 8);
  out++;
  *out = ((*in) >> 8);
  ++in;
  out++;

  return in;
}